

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

CVmHashEntry * __thiscall CVmHashTable::find(CVmHashTable *this,char *str,size_t len)

{
  uint uVar1;
  int iVar2;
  CVmHashTable *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  CVmHashEntry *entry;
  uint hash;
  size_t in_stack_ffffffffffffffd0;
  CVmHashEntry *pCVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar1 = compute_hash(in_RDX,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0);
  pCVar3 = *(CVmHashEntry **)(*in_RDI + (ulong)uVar1 * 8);
  while( true ) {
    if (pCVar3 == (CVmHashEntry *)0x0) {
      return (CVmHashEntry *)0x0;
    }
    iVar2 = (*pCVar3->_vptr_CVmHashEntry[2])(pCVar3,in_RSI,in_RDX);
    if (iVar2 != 0) break;
    pCVar3 = pCVar3->nxt_;
  }
  return pCVar3;
}

Assistant:

CVmHashEntry *CVmHashTable::find(const char *str, size_t len) const
{
    unsigned int hash;
    CVmHashEntry *entry;

    /* compute the hash value for this entry */
    hash = compute_hash(str, len);

    /* scan the list at this hash value looking for a match */
    for (entry = table_[hash] ; entry ; entry = entry->nxt_)
    {
        /* if this one matches, return it */
        if (entry->matches(str, len))
            return entry;
    }

    /* didn't find anything */
    return 0;
}